

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O1

iterator __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::AddNodeReturningIterator
          (ValidPolicyGraph *this,Input policy,
          vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  byte bVar3;
  byte bVar4;
  pointer pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  pointer pIVar8;
  bool bVar9;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  uchar *puVar12;
  undefined1 *puVar13;
  _Link_type __p;
  undefined7 uVar14;
  undefined1 *puVar15;
  _Rb_tree_node_base *p_Var16;
  bool bVar17;
  Input rhs;
  
  puVar12 = policy.data_.data_;
  rhs.data_.size_ = 4;
  rhs.data_.data_ = "U\x1d ";
  __p = (_Link_type)policy.data_.size_;
  bVar9 = bssl::der::operator!=(policy,rhs);
  if (!bVar9) {
    __assert_fail("policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2d0,
                  "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
                 );
  }
  pmVar5 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var6 = (_Base_ptr)
           (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var7 = (_Base_ptr)
           (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar8 = (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Rb_tree_node_base *)operator_new(0x50);
  *(uchar **)(this_00 + 1) = puVar12;
  this_00[1]._M_parent = (_Base_ptr)policy.data_.size_;
  this_00[1]._M_left = p_Var6;
  this_00[1]._M_right = p_Var7;
  *(pointer *)(this_00 + 2) = pIVar8;
  *(undefined2 *)&this_00[2]._M_parent = 0;
  p_Var1 = &pmVar5[-1]._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var11 == (_Rb_tree_node_base *)0x0) {
    bVar9 = true;
    p_Var16 = &p_Var1->_M_header;
  }
  else {
    do {
      p_Var16 = p_Var11;
      p_Var6 = p_Var16[1]._M_parent;
      bVar9 = p_Var6 != (_Base_ptr)0x0;
      if ((this_00[1]._M_parent != (_Base_ptr)0x0) && (p_Var6 != (_Base_ptr)0x0)) {
        puVar13 = (undefined1 *)((long)&p_Var6[-1]._M_right + 7);
        puVar15 = (undefined1 *)0x0;
        while( true ) {
          bVar3 = puVar12[(long)puVar15];
          bVar4 = puVar15[*(long *)(p_Var16 + 1)];
          if (bVar3 < bVar4) {
            bVar9 = true;
            goto LAB_004c3b3f;
          }
          if (bVar3 >= bVar4 && bVar3 != bVar4) break;
          bVar9 = puVar13 != puVar15;
          if (((undefined1 *)((long)&this_00[1]._M_parent[-1]._M_right + 7) == puVar15) ||
             (bVar17 = puVar13 == puVar15, puVar15 = puVar15 + 1, bVar17)) goto LAB_004c3b3f;
        }
        bVar9 = false;
      }
LAB_004c3b3f:
      __p = (_Link_type)(ulong)(bVar9 ^ 1);
      p_Var11 = (&p_Var16->_M_left)[(long)__p];
    } while (p_Var11 != (_Base_ptr)0x0);
  }
  p_Var10 = p_Var16;
  if (bVar9 != false) {
    if (p_Var16 == pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_004c3bd8;
    p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var16);
  }
  p_Var6 = this_00[1]._M_parent;
  __p = (_Link_type)CONCAT71((int7)((ulong)__p >> 8),p_Var6 != (_Base_ptr)0x0);
  if (p_Var10[1]._M_parent != (_Base_ptr)0x0 && p_Var6 != (_Base_ptr)0x0) {
    puVar13 = (undefined1 *)((long)&p_Var6[-1]._M_right + 7);
    puVar15 = (undefined1 *)0x0;
    while( true ) {
      bVar3 = puVar15[*(long *)(p_Var10 + 1)];
      uVar14 = (undefined7)((ulong)__p >> 8);
      bVar4 = puVar12[(long)puVar15];
      if (bVar3 < bVar4) {
        __p = (_Link_type)CONCAT71(uVar14,1);
        goto LAB_004c3bcb;
      }
      if (bVar3 >= bVar4 && bVar3 != bVar4) break;
      __p = (_Link_type)CONCAT71(uVar14,puVar13 != puVar15);
      if (((undefined1 *)((long)&p_Var10[1]._M_parent[-1]._M_right + 7) == puVar15) ||
         (bVar9 = puVar13 == puVar15, puVar15 = puVar15 + 1, bVar9)) goto LAB_004c3bcb;
    }
    __p = (_Link_type)0x0;
  }
LAB_004c3bcb:
  if ((char)__p == '\0') {
    p_Var11 = p_Var10;
    p_Var16 = (_Rb_tree_node_base *)0x0;
  }
LAB_004c3bd8:
  if (p_Var16 == (_Rb_tree_node_base *)0x0) {
    ::std::
    _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
    ::_M_drop_node((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                    *)this_00,__p);
  }
  else {
    if ((p_Var11 == (_Rb_tree_node_base *)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var16)) {
      p_Var6 = p_Var16[1]._M_parent;
      bVar9 = p_Var6 != (_Base_ptr)0x0;
      if ((this_00[1]._M_parent != (_Base_ptr)0x0) && (p_Var6 != (_Base_ptr)0x0)) {
        puVar13 = (undefined1 *)((long)&p_Var6[-1]._M_right + 7);
        puVar15 = (undefined1 *)0x0;
        while( true ) {
          bVar3 = puVar12[(long)puVar15];
          bVar4 = puVar15[*(long *)(p_Var16 + 1)];
          if (bVar3 < bVar4) goto LAB_004c3c40;
          if (bVar3 >= bVar4 && bVar3 != bVar4) break;
          bVar9 = puVar13 != puVar15;
          if (((undefined1 *)((long)&this_00[1]._M_parent[-1]._M_right + 7) == puVar15) ||
             (bVar17 = puVar13 == puVar15, puVar15 = puVar15 + 1, bVar17)) goto LAB_004c3c42;
        }
        bVar9 = false;
      }
    }
    else {
LAB_004c3c40:
      bVar9 = true;
    }
LAB_004c3c42:
    ::std::_Rb_tree_insert_and_rebalance(bVar9,this_00,p_Var16,&p_Var1->_M_header);
    psVar2 = &pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
    p_Var11 = this_00;
  }
  if (p_Var16 != (_Rb_tree_node_base *)0x0) {
    return (iterator)p_Var11;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                ,0x2d6,
                "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
               );
}

Assistant:

Level::iterator AddNodeReturningIterator(
      der::Input policy, std::vector<der::Input> parent_policies) {
    assert(policy != der::Input(kAnyPolicyOid));
    auto [iter, inserted] = levels_.back().insert(
        std::pair{policy, Node{std::move(parent_policies)}});
    // GCC before 8.1 tracks individual unused bindings and does not support
    // marking them [[maybe_unused]].
    (void)inserted;
    assert(inserted);
    return iter;
  }